

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

string * cmInstallGenerator::ConvertToAbsoluteDestination
                   (string *__return_storage_ptr__,string *dest)

{
  bool bVar1;
  ulong uVar2;
  string *dest_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (bVar1 = cmsys::SystemTools::FileIsFullPath(dest), !bVar1)) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"${CMAKE_INSTALL_PREFIX}/");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)dest);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallGenerator::ConvertToAbsoluteDestination(
  std::string const& dest)
{
  std::string result;
  if (!dest.empty() && !cmSystemTools::FileIsFullPath(dest)) {
    result = "${CMAKE_INSTALL_PREFIX}/";
  }
  result += dest;
  return result;
}